

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O1

Clause * __thiscall EditDistance::getNaiveExplanation(EditDistance *this)

{
  long *plVar1;
  bool bVar2;
  Clause *pCVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Clause *c;
  Clause *local_30;
  
  iVar4 = this->seqSize;
  local_30 = (Clause *)malloc((long)iVar4 * 8 + 0xc);
  *(uint *)local_30 = (*(uint *)local_30 & 0xfc) + (iVar4 * 2 + 1) * 0x100 + 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_30);
  pCVar3 = local_30;
  iVar4 = this->seqSize;
  if (0 < iVar4) {
    lVar5 = 0;
    uVar7 = 1;
    do {
      plVar1 = *(long **)((long)&this->seq1->var + lVar5);
      iVar4 = (**(code **)(*plVar1 + 0x68))(plVar1,(long)*(int *)((long)plVar1 + 0xc),0);
      if (*(uint *)pCVar3 >> 8 <= uVar7) goto LAB_0016e49b;
      pCVar3->data[uVar7].x = iVar4;
      iVar4 = this->seqSize;
      lVar5 = lVar5 + 0x10;
      bVar2 = (long)uVar7 < (long)iVar4;
      uVar7 = uVar7 + 1;
    } while (bVar2);
  }
  if (0 < this->seqSize) {
    lVar8 = (long)(iVar4 + 1);
    lVar5 = 0;
    lVar6 = 0;
    do {
      plVar1 = *(long **)((long)&this->seq2->var + lVar5);
      iVar4 = (**(code **)(*plVar1 + 0x68))(plVar1,(long)*(int *)((long)plVar1 + 0xc),0);
      if ((long)(ulong)(*(uint *)pCVar3 >> 8) <= lVar8) {
LAB_0016e49b:
        abort();
      }
      pCVar3->data[lVar8].x = iVar4;
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->seqSize);
  }
  return pCVar3;
}

Assistant:

Clause* getNaiveExplanation() const {
		// count number of possible values in total

		const int clauseSize = seqSize * 2 + 1;

		Clause* r = Reason_new(clauseSize);

		int offset = 1;

		// insert all clauses for each variable in sequence 1
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq1[i].getLit(seq1[i].getVal(), LR_NE);
		}
		offset += seqSize;
		// insert all clauses for each variable in sequence 2
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq2[i].getLit(seq2[i].getVal(), LR_NE);
		}

		return r;
	}